

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M3DImporter.cpp
# Opt level: O3

void __thiscall Assimp::M3DImporter::importAnimations(M3DImporter *this,M3DWrapper *m3d)

{
  undefined8 *puVar1;
  M3D_INDEX MVar2;
  m3da_t *pmVar3;
  m3dfr_t *pmVar4;
  m3dtr_t *pmVar5;
  m3dv_t *pmVar6;
  double dVar7;
  long *plVar8;
  long lVar9;
  uint uVar10;
  Logger *this_00;
  aiAnimation **ppaVar11;
  aiAnimation *paVar12;
  aiNodeAnim **ppaVar13;
  aiNodeAnim *paVar14;
  aiVectorKey *paVar15;
  aiQuatKey *paVar16;
  m3d_t *pmVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  aiQuatKey *paVar21;
  size_t sVar22;
  ulong uVar23;
  long lVar24;
  allocator<char> local_481;
  long *local_480;
  ulong local_478;
  long local_470 [2];
  M3DImporter *local_460;
  m3da_t *local_458;
  char *local_450;
  long local_448;
  ulong local_440;
  undefined1 local_438 [1032];
  
  local_460 = this;
  if (this->mScene == (aiScene *)0x0) {
    __assert_fail("mScene != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x205,"void Assimp::M3DImporter::importAnimations(const M3DWrapper &)");
  }
  if (m3d->m3d_ != (m3d_t *)0x0) {
    this->mScene->mNumAnimations = m3d->m3d_->numaction;
    this_00 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[23]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438,
               (char (*) [23])"M3D: importAnimations ");
    std::ostream::_M_insert<unsigned_long>((ulong)local_438);
    std::__cxx11::stringbuf::str();
    Logger::debug(this_00,(char *)local_480);
    if (local_480 != local_470) {
      operator_delete(local_480,local_470[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
    std::ios_base::~ios_base((ios_base *)(local_438 + 0x70));
    uVar23 = (ulong)m3d->m3d_->numaction;
    if ((uVar23 != 0) && (m3d->m3d_->numbone != 0)) {
      ppaVar11 = (aiAnimation **)operator_new__(uVar23 << 3);
      local_460->mScene->mAnimations = ppaVar11;
      pmVar17 = m3d->m3d_;
      if (pmVar17->numaction != 0) {
        uVar23 = 0;
        do {
          pmVar3 = pmVar17->action;
          local_440 = uVar23;
          paVar12 = (aiAnimation *)operator_new(0x448);
          (paVar12->mName).length = 0;
          local_450 = (paVar12->mName).data;
          (paVar12->mName).data[0] = '\0';
          memset((paVar12->mName).data + 1,0x1b,0x3ff);
          paVar12->mDuration = -1.0;
          paVar12->mTicksPerSecond = 0.0;
          paVar12->mNumChannels = 0;
          paVar12->mChannels = (aiNodeAnim **)0x0;
          paVar12->mNumMeshChannels = 0;
          paVar12->mMeshChannels = (aiMeshAnim **)0x0;
          paVar12->mNumMorphMeshChannels = 0;
          paVar12->mMorphMeshChannels = (aiMeshMorphAnim **)0x0;
          local_458 = pmVar3;
          local_448 = uVar23 * 3;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_480,pmVar3[uVar23].name,&local_481);
          plVar8 = local_480;
          sVar22 = local_478 & 0xffffffff;
          if ((local_478 & 0xfffffc00) != 0) {
            sVar22 = 0x3ff;
          }
          local_438._0_4_ = (ai_uint32)sVar22;
          memcpy(local_438 + 4,local_480,sVar22);
          local_438[sVar22 + 4] = 0;
          (paVar12->mName).length = (ai_uint32)sVar22;
          memcpy(local_450,local_438 + 4,sVar22);
          (paVar12->mName).data[sVar22] = '\0';
          if (plVar8 != local_470) {
            operator_delete(plVar8,local_470[0] + 1);
          }
          lVar9 = local_448;
          pmVar3 = local_458;
          paVar12->mDuration = (double)(&local_458->durationmsec)[local_448 * 2] / 10.0;
          paVar12->mTicksPerSecond = 100.0;
          pmVar17 = m3d->m3d_;
          uVar10 = pmVar17->numbone;
          paVar12->mNumChannels = uVar10;
          ppaVar13 = (aiNodeAnim **)operator_new__((ulong)uVar10 << 3);
          paVar12->mChannels = ppaVar13;
          if (pmVar17->numbone != 0) {
            uVar23 = 0;
            do {
              paVar14 = (aiNodeAnim *)operator_new(0x438);
              (paVar14->mNodeName).length = 0;
              (paVar14->mNodeName).data[0] = '\0';
              memset((paVar14->mNodeName).data + 1,0x1b,0x3ff);
              paVar14->mRotationKeys = (aiQuatKey *)0x0;
              paVar14->mNumScalingKeys = 0;
              *(undefined8 *)&paVar14->mNumPositionKeys = 0;
              *(undefined8 *)((long)&paVar14->mPositionKeys + 4) = 0;
              paVar14->mScalingKeys = (aiVectorKey *)0x0;
              paVar14->mPreState = aiAnimBehaviour_DEFAULT;
              paVar14->mPostState = aiAnimBehaviour_DEFAULT;
              paVar12->mChannels[uVar23] = paVar14;
              local_458 = (m3da_t *)(uVar23 * 0x68);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_480,m3d->m3d_->bone[uVar23].name,&local_481);
              sVar22 = local_478 & 0xffffffff;
              if ((local_478 & 0xfffffc00) != 0) {
                sVar22 = 0x3ff;
              }
              local_438._0_4_ = (ai_uint32)sVar22;
              memcpy(local_438 + 4,local_480,sVar22);
              local_438[sVar22 + 4] = 0;
              paVar14 = paVar12->mChannels[uVar23];
              (paVar14->mNodeName).length = (ai_uint32)sVar22;
              memcpy((paVar14->mNodeName).data,local_438 + 4,sVar22);
              (paVar14->mNodeName).data[sVar22] = '\0';
              if (local_480 != local_470) {
                operator_delete(local_480,local_470[0] + 1);
              }
              MVar2 = (&pmVar3->numframe)[lVar9 * 2];
              paVar12->mChannels[uVar23]->mNumRotationKeys = MVar2;
              paVar12->mChannels[uVar23]->mNumPositionKeys = MVar2;
              uVar10 = (&pmVar3->numframe)[lVar9 * 2];
              uVar19 = (ulong)uVar10 * 0x18;
              paVar15 = (aiVectorKey *)operator_new__(uVar19);
              if ((ulong)uVar10 != 0) {
                uVar18 = 0;
                do {
                  puVar1 = (undefined8 *)((long)&paVar15->mTime + uVar18);
                  *puVar1 = 0;
                  puVar1[1] = 0;
                  *(undefined4 *)((long)&(paVar15->mValue).z + uVar18) = 0;
                  uVar18 = uVar18 + 0x18;
                } while (uVar19 != uVar18);
              }
              paVar12->mChannels[uVar23]->mPositionKeys = paVar15;
              uVar19 = (ulong)(&pmVar3->numframe)[lVar9 * 2];
              paVar16 = (aiQuatKey *)operator_new__(uVar19 * 0x18);
              if (uVar19 != 0) {
                paVar21 = paVar16;
                do {
                  paVar21->mTime = 0.0;
                  (paVar21->mValue).w = 1.0;
                  (paVar21->mValue).x = 0.0;
                  (paVar21->mValue).y = 0.0;
                  (paVar21->mValue).z = 0.0;
                  paVar21 = paVar21 + 1;
                } while (paVar21 != paVar16 + uVar19);
              }
              paVar12->mChannels[uVar23]->mRotationKeys = paVar16;
              pmVar17 = m3d->m3d_;
              if ((&pmVar3->numframe)[lVar9 * 2] != 0) {
                uVar10 = *(uint *)((long)&pmVar17->bone->pos + (long)local_458);
                uVar20 = *(uint *)((long)&pmVar17->bone->ori + (long)local_458);
                uVar19 = 0;
                do {
                  pmVar4 = (&pmVar3->frame)[lVar9];
                  dVar7 = (double)pmVar4[uVar19].msec / 10.0;
                  if ((ulong)pmVar4[uVar19].numtransform != 0) {
                    pmVar5 = pmVar4[uVar19].transform;
                    lVar24 = 0;
                    do {
                      if (uVar23 == *(uint *)((long)&pmVar5->boneid + lVar24)) {
                        uVar10 = *(uint *)((long)&pmVar5->pos + lVar24);
                        uVar20 = *(uint *)((long)&pmVar5->ori + lVar24);
                      }
                      lVar24 = lVar24 + 0xc;
                    } while ((ulong)pmVar4[uVar19].numtransform * 0xc != lVar24);
                  }
                  pmVar6 = m3d->m3d_->vertex;
                  paVar12->mChannels[uVar23]->mPositionKeys[uVar19].mTime = dVar7;
                  paVar12->mChannels[uVar23]->mPositionKeys[uVar19].mValue.x = pmVar6[uVar10].x;
                  paVar12->mChannels[uVar23]->mPositionKeys[uVar19].mValue.y = pmVar6[uVar10].y;
                  paVar12->mChannels[uVar23]->mPositionKeys[uVar19].mValue.z = pmVar6[uVar10].z;
                  paVar12->mChannels[uVar23]->mRotationKeys[uVar19].mTime = dVar7;
                  paVar12->mChannels[uVar23]->mRotationKeys[uVar19].mValue.w = pmVar6[uVar20].w;
                  paVar12->mChannels[uVar23]->mRotationKeys[uVar19].mValue.x = pmVar6[uVar20].x;
                  paVar12->mChannels[uVar23]->mRotationKeys[uVar19].mValue.y = pmVar6[uVar20].y;
                  paVar12->mChannels[uVar23]->mRotationKeys[uVar19].mValue.z = pmVar6[uVar20].z;
                  uVar19 = uVar19 + 1;
                } while (uVar19 < (&pmVar3->numframe)[lVar9 * 2]);
                pmVar17 = m3d->m3d_;
              }
              uVar23 = uVar23 + 1;
            } while (uVar23 < pmVar17->numbone);
          }
          local_460->mScene->mAnimations[local_440] = paVar12;
          uVar23 = local_440 + 1;
          pmVar17 = m3d->m3d_;
        } while (uVar23 < pmVar17->numaction);
      }
    }
    return;
  }
  __assert_fail("m3d",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                ,0x206,"void Assimp::M3DImporter::importAnimations(const M3DWrapper &)");
}

Assistant:

void M3DImporter::importAnimations(const M3DWrapper &m3d) {
	unsigned int i, j, k, l, pos, ori;
	double t;
	m3da_t *a;

	ai_assert(mScene != nullptr);
	ai_assert(m3d);

	mScene->mNumAnimations = m3d->numaction;

	ASSIMP_LOG_DEBUG_F("M3D: importAnimations ", mScene->mNumAnimations);

	if (!m3d->numaction || !m3d->numbone)
		return;

	mScene->mAnimations = new aiAnimation *[m3d->numaction];
	for (i = 0; i < m3d->numaction; i++) {
		a = &m3d->action[i];
		aiAnimation *pAnim = new aiAnimation;
		pAnim->mName = aiString(std::string(a->name));
		pAnim->mDuration = ((double)a->durationmsec) / 10;
		pAnim->mTicksPerSecond = 100;
		// now we know how many bones are referenced in this animation
		pAnim->mNumChannels = m3d->numbone;
		pAnim->mChannels = new aiNodeAnim *[pAnim->mNumChannels];
		for (l = 0; l < m3d->numbone; l++) {
			unsigned int n;
			pAnim->mChannels[l] = new aiNodeAnim;
			pAnim->mChannels[l]->mNodeName = aiString(std::string(m3d->bone[l].name));
			// now n is the size of positions / orientations arrays
			pAnim->mChannels[l]->mNumPositionKeys = pAnim->mChannels[l]->mNumRotationKeys = a->numframe;
			pAnim->mChannels[l]->mPositionKeys = new aiVectorKey[a->numframe];
			pAnim->mChannels[l]->mRotationKeys = new aiQuatKey[a->numframe];
			pos = m3d->bone[l].pos;
			ori = m3d->bone[l].ori;
			for (j = n = 0; j < a->numframe; j++) {
				t = ((double)a->frame[j].msec) / 10;
				for (k = 0; k < a->frame[j].numtransform; k++) {
					if (a->frame[j].transform[k].boneid == l) {
						pos = a->frame[j].transform[k].pos;
						ori = a->frame[j].transform[k].ori;
					}
				}
				m3dv_t *v = &m3d->vertex[pos];
				m3dv_t *q = &m3d->vertex[ori];
				pAnim->mChannels[l]->mPositionKeys[j].mTime = t;
				pAnim->mChannels[l]->mPositionKeys[j].mValue.x = v->x;
				pAnim->mChannels[l]->mPositionKeys[j].mValue.y = v->y;
				pAnim->mChannels[l]->mPositionKeys[j].mValue.z = v->z;
				pAnim->mChannels[l]->mRotationKeys[j].mTime = t;
				pAnim->mChannels[l]->mRotationKeys[j].mValue.w = q->w;
				pAnim->mChannels[l]->mRotationKeys[j].mValue.x = q->x;
				pAnim->mChannels[l]->mRotationKeys[j].mValue.y = q->y;
				pAnim->mChannels[l]->mRotationKeys[j].mValue.z = q->z;
			} // foreach frame
		} // foreach bones
		mScene->mAnimations[i] = pAnim;
	}
}